

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O2

void helics::CoreFactory::unregisterCore(string_view name)

{
  bool bVar1;
  allocator<char> local_61;
  string local_60;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_60,&local_20,&local_61);
  bVar1 = gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::removeObject
                    ((SearchableObjectHolder<helics::Core,_helics::CoreType> *)searchableCores,
                     &local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar1) {
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<bool_(const_std::shared_ptr<helics::Core>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreFactory.cpp:413:38)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<bool_(const_std::shared_ptr<helics::Core>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreFactory.cpp:413:38)>
               ::_M_manager;
    local_40._M_unused._M_object = &local_20;
    gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::removeObject
              ((SearchableObjectHolder<helics::Core,_helics::CoreType> *)searchableCores,
               (function<bool_(const_std::shared_ptr<helics::Core>_&)> *)&local_40);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  }
  return;
}

Assistant:

void unregisterCore(std::string_view name)
{
    if (!searchableCores.removeObject(std::string{name})) {
        searchableCores.removeObject([&name](auto& obj) { return (obj->getIdentifier() == name); });
    }
}